

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::EmitSwiftDependencyInfo
          (cmNinjaTargetGenerator *this,cmSourceFile *source,string *config)

{
  cmLocalNinjaGenerator *pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  string *psVar3;
  cmValue cVar4;
  Value *pVVar5;
  mapped_type *pmVar6;
  string_view source_00;
  string_view source_01;
  Value entry;
  ValueHolder local_1b0;
  char *local_1a8;
  char local_1a0 [32];
  string local_180;
  string dependFileName;
  cmSourceFile *local_138;
  ValueHolder local_130 [4];
  string objectFileName;
  string objectFilePath;
  string makeDepsPath;
  string swiftDiaPath;
  string swiftDepsPath;
  string objectFileDir;
  string sourceFilePath;
  
  GetCompiledSourceNinjaPath_abi_cxx11_(&sourceFilePath,this,source);
  GetObjectFilePath((string *)&entry,this,source,config);
  psVar3 = ConvertToNinjaPath(this,(string *)&entry);
  std::__cxx11::string::string((string *)&objectFilePath,(string *)psVar3);
  std::__cxx11::string::~string((string *)&entry);
  std::__cxx11::string::string((string *)&local_138,(string *)&objectFilePath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&entry,"Swift_DEPENDENCIES_FILE",(allocator<char> *)&local_1b0.bool_);
  cVar4 = cmSourceFile::GetProperty(source,(string *)&entry);
  std::__cxx11::string::~string((string *)&entry);
  if (cVar4.Value == (string *)0x0) {
    entry.value_ = local_130[0];
    entry._8_8_ = local_138;
    local_1b0.int_ = 10;
    local_1a8 = ".swiftdeps";
    cmStrCat<>(&swiftDepsPath,(cmAlphaNum *)&entry,(cmAlphaNum *)&local_1b0);
  }
  else {
    std::__cxx11::string::string((string *)&swiftDepsPath,(string *)cVar4.Value);
  }
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string((string *)&local_138,(string *)&objectFilePath);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&entry,"Swift_DIAGNOSTICS_FILE",(allocator<char> *)&local_1b0.bool_);
  cVar4 = cmSourceFile::GetProperty(source,(string *)&entry);
  std::__cxx11::string::~string((string *)&entry);
  if (cVar4.Value == (string *)0x0) {
    entry.value_ = local_130[0];
    entry._8_8_ = local_138;
    local_1b0.int_ = 4;
    local_1a8 = ".dia";
    cmStrCat<>(&swiftDiaPath,(cmAlphaNum *)&entry,(cmAlphaNum *)&local_1b0);
  }
  else {
    std::__cxx11::string::string((string *)&swiftDiaPath,(string *)cVar4.Value);
  }
  std::__cxx11::string::~string((string *)&local_138);
  local_138 = source;
  std::__cxx11::string::string((string *)&local_130[0].bool_,(string *)config);
  pcVar1 = this->LocalGenerator;
  GetObjectFilePath((string *)&entry,this,local_138,(string *)local_130);
  psVar3 = ConvertToNinjaPath(this,(string *)&entry);
  std::__cxx11::string::string((string *)&objectFileName,(string *)psVar3);
  std::__cxx11::string::~string((string *)&entry);
  cmsys::SystemTools::GetFilenamePath(&objectFileDir,&objectFileName);
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&entry,"CMAKE_Swift_DEPFLE_EXTNSION_REPLACE",
             (allocator<char> *)&local_1b0.bool_);
  bVar2 = cmMakefile::IsOn(this_00,(string *)&entry);
  std::__cxx11::string::~string((string *)&entry);
  if (bVar2) {
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_180,&objectFileName);
    entry.value_.int_ = local_180._M_string_length;
    entry._8_8_ = local_180._M_dataplus._M_p;
    local_1b0.int_ = 2;
    local_1a8 = ".d";
    cmStrCat<>(&dependFileName,(cmAlphaNum *)&entry,(cmAlphaNum *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_180);
    entry.value_.uint_ = objectFileDir._M_string_length;
    entry._8_8_ = objectFileDir._M_dataplus._M_p;
    local_1a8 = local_1a0;
    local_1b0.int_ = 1;
    local_1a0[0] = '/';
    cmStrCat<std::__cxx11::string>
              (&local_180,(cmAlphaNum *)&entry,(cmAlphaNum *)&local_1b0,&dependFileName);
    source_00._M_str = local_180._M_dataplus._M_p;
    source_00._M_len = local_180._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&makeDepsPath,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_00,SHELL);
    std::__cxx11::string::~string((string *)&local_180);
  }
  else {
    entry.value_.uint_ = objectFileName._M_string_length;
    entry._8_8_ = objectFileName._M_dataplus._M_p;
    local_1b0.int_ = 2;
    local_1a8 = ".d";
    cmStrCat<>(&dependFileName,(cmAlphaNum *)&entry,(cmAlphaNum *)&local_1b0);
    source_01._M_str = dependFileName._M_dataplus._M_p;
    source_01._M_len = dependFileName._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&makeDepsPath,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_01,SHELL);
  }
  std::__cxx11::string::~string((string *)&dependFileName);
  std::__cxx11::string::~string((string *)&objectFileDir);
  std::__cxx11::string::~string((string *)&objectFileName);
  std::__cxx11::string::~string((string *)&local_130[0].bool_);
  Json::Value::Value(&entry,objectValue);
  Json::Value::Value((Value *)&local_1b0,&objectFilePath);
  pVVar5 = Json::Value::operator[](&entry,"object");
  Json::Value::operator=(pVVar5,(Value *)&local_1b0);
  Json::Value::~Value((Value *)&local_1b0);
  Json::Value::Value((Value *)&local_1b0,&makeDepsPath);
  pVVar5 = Json::Value::operator[](&entry,"dependencies");
  Json::Value::operator=(pVVar5,(Value *)&local_1b0);
  Json::Value::~Value((Value *)&local_1b0);
  Json::Value::Value((Value *)&local_1b0,&swiftDepsPath);
  pVVar5 = Json::Value::operator[](&entry,"swift-dependencies");
  Json::Value::operator=(pVVar5,(Value *)&local_1b0);
  Json::Value::~Value((Value *)&local_1b0);
  Json::Value::Value((Value *)&local_1b0,&swiftDiaPath);
  pVVar5 = Json::Value::operator[](&entry,"diagnostics");
  Json::Value::operator=(pVVar5,(Value *)&local_1b0);
  Json::Value::~Value((Value *)&local_1b0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
           ::operator[](&this->Configs,config);
  pVVar5 = Json::Value::operator[](&pmVar6->SwiftOutputMap,&sourceFilePath);
  Json::Value::operator=(pVVar5,&entry);
  Json::Value::~Value(&entry);
  std::__cxx11::string::~string((string *)&makeDepsPath);
  std::__cxx11::string::~string((string *)&swiftDiaPath);
  std::__cxx11::string::~string((string *)&swiftDepsPath);
  std::__cxx11::string::~string((string *)&objectFilePath);
  std::__cxx11::string::~string((string *)&sourceFilePath);
  return;
}

Assistant:

void cmNinjaTargetGenerator::EmitSwiftDependencyInfo(
  cmSourceFile const* source, const std::string& config)
{
  std::string const sourceFilePath = this->GetCompiledSourceNinjaPath(source);
  std::string const objectFilePath =
    this->ConvertToNinjaPath(this->GetObjectFilePath(source, config));
  std::string const swiftDepsPath = [source, objectFilePath]() -> std::string {
    if (cmValue name = source->GetProperty("Swift_DEPENDENCIES_FILE")) {
      return *name;
    }
    return cmStrCat(objectFilePath, ".swiftdeps");
  }();
  std::string const swiftDiaPath = [source, objectFilePath]() -> std::string {
    if (cmValue name = source->GetProperty("Swift_DIAGNOSTICS_FILE")) {
      return *name;
    }
    return cmStrCat(objectFilePath, ".dia");
  }();
  std::string const makeDepsPath = [this, source, config]() -> std::string {
    cmLocalNinjaGenerator const* local = this->GetLocalGenerator();
    std::string const objectFileName =
      this->ConvertToNinjaPath(this->GetObjectFilePath(source, config));
    std::string const objectFileDir =
      cmSystemTools::GetFilenamePath(objectFileName);

    if (this->Makefile->IsOn("CMAKE_Swift_DEPFLE_EXTNSION_REPLACE")) {
      std::string dependFileName = cmStrCat(
        cmSystemTools::GetFilenameWithoutLastExtension(objectFileName), ".d");
      return local->ConvertToOutputFormat(
        cmStrCat(objectFileDir, '/', dependFileName),
        cmOutputConverter::SHELL);
    }
    return local->ConvertToOutputFormat(cmStrCat(objectFileName, ".d"),
                                        cmOutputConverter::SHELL);
  }();

  // build the source file mapping
  // https://github.com/apple/swift/blob/master/docs/Driver.md#output-file-maps
  Json::Value entry = Json::Value(Json::objectValue);
  entry["object"] = objectFilePath;
  entry["dependencies"] = makeDepsPath;
  entry["swift-dependencies"] = swiftDepsPath;
  entry["diagnostics"] = swiftDiaPath;
  this->Configs[config].SwiftOutputMap[sourceFilePath] = entry;
}